

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtz.cpp
# Opt level: O1

UBool __thiscall
icu_63::RuleBasedTimeZone::findNext
          (RuleBasedTimeZone *this,UDate base,UBool inclusive,UDate *transitionTime,
          TimeZoneRule **fromRule,TimeZoneRule **toRule)

{
  bool bVar1;
  bool bVar2;
  UBool UVar3;
  int32_t iVar4;
  int32_t iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  TimeZoneRule *this_00;
  TimeZoneRule *pTVar10;
  TimeZoneRule *this_01;
  TimeZoneRule *this_02;
  int iVar11;
  char cVar12;
  byte bVar13;
  undefined7 in_register_00000031;
  bool bVar14;
  _func_int **pp_Var15;
  UDate start0;
  UDate start1;
  _func_int **local_40;
  _func_int **local_38;
  
  if (this->fHistoricTransitions == (UVector *)0x0) {
    return '\0';
  }
  pTVar10 = (TimeZoneRule *)(CONCAT71(in_register_00000031,inclusive) & 0xffffffff);
  pdVar9 = (double *)UVector::elementAt(this->fHistoricTransitions,0);
  pp_Var15 = (_func_int **)*pdVar9;
  if (base < (double)pp_Var15) {
LAB_001ed9b1:
    pTVar10 = (TimeZoneRule *)pdVar9[1];
    this_00 = (TimeZoneRule *)pdVar9[2];
    bVar1 = true;
    bVar2 = false;
    goto LAB_001ed9be;
  }
  cVar12 = (char)pTVar10;
  if (cVar12 != '\0') {
    if (((double)pp_Var15 == base) && (!NAN((double)pp_Var15) && !NAN(base))) goto LAB_001ed9b1;
  }
  iVar11 = this->fHistoricTransitions->count;
  this_00 = (TimeZoneRule *)UVector::elementAt(this->fHistoricTransitions,iVar11 + -1);
  pp_Var15 = (this_00->super_UObject)._vptr_UObject;
  if (cVar12 == '\0') {
LAB_001eda73:
    if (base < (double)pp_Var15) {
      if (2 < iVar11) {
        pTVar10 = (TimeZoneRule *)UVector::elementAt(this->fHistoricTransitions,iVar11 + -2);
        pp_Var15 = (pTVar10->super_UObject)._vptr_UObject;
        if ((base <= (double)pp_Var15) && (cVar12 != '\0' || base != (double)pp_Var15)) {
          iVar11 = iVar11 + -3;
          while (this_00 = pTVar10, 1 < iVar11 + 1) {
            pTVar10 = (TimeZoneRule *)UVector::elementAt(this->fHistoricTransitions,iVar11);
            pp_Var15 = (pTVar10->super_UObject)._vptr_UObject;
            if (((double)pp_Var15 < base) ||
               (iVar11 = iVar11 + -1, cVar12 == '\0' && base == (double)pp_Var15)) break;
          }
        }
      }
      pp_Var15 = (this_00->super_UObject)._vptr_UObject;
      goto LAB_001edb04;
    }
    if (this->fFinalRules == (UVector *)0x0) {
      bVar14 = true;
      bVar1 = false;
      bVar2 = false;
    }
    else {
      bVar1 = false;
      this_01 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,0);
      this_02 = (TimeZoneRule *)UVector::elementAt(this->fFinalRules,1);
      uVar6 = TimeZoneRule::getRawOffset(this_02);
      uVar7 = TimeZoneRule::getDSTSavings(this_02);
      iVar11 = (*(this_01->super_UObject)._vptr_UObject[9])
                         (base,this_01,(ulong)uVar6,(ulong)uVar7,(ulong)(uint)(int)cVar12,&local_40)
      ;
      uVar6 = TimeZoneRule::getRawOffset(this_01);
      uVar7 = TimeZoneRule::getDSTSavings(this_01);
      iVar8 = (*(this_02->super_UObject)._vptr_UObject[9])
                        (base,this_02,(ulong)uVar6,(ulong)uVar7,(ulong)(uint)(int)cVar12,&local_38);
      bVar13 = (byte)iVar11 | (byte)iVar8;
      bVar14 = bVar13 != 0;
      pTVar10 = (TimeZoneRule *)(ulong)CONCAT31((int3)((uint)iVar11 >> 8),bVar13);
      this_00 = this_01;
      bVar2 = bVar1;
      if ((bVar14) &&
         (((byte)iVar8 == 0 ||
          (bVar1 = true, pTVar10 = this_01, this_00 = this_02, pp_Var15 = local_38, bVar2 = bVar1,
          (double)local_40 < (double)local_38)))) {
        bVar1 = true;
        pTVar10 = this_02;
        this_00 = this_01;
        pp_Var15 = local_40;
        bVar2 = bVar1;
      }
    }
  }
  else {
    if (((double)pp_Var15 != base) || (NAN((double)pp_Var15) || NAN(base))) goto LAB_001eda73;
LAB_001edb04:
    bVar1 = true;
    bVar14 = true;
    pTVar10 = (TimeZoneRule *)(this_00->fName).super_Replaceable.super_UObject._vptr_UObject;
    this_00 = *(TimeZoneRule **)&(this_00->fName).fUnion;
    bVar2 = false;
  }
  if (!bVar14) {
    return '\0';
  }
LAB_001ed9be:
  if (!bVar1) {
    return '\0';
  }
  iVar4 = TimeZoneRule::getRawOffset(pTVar10);
  iVar5 = TimeZoneRule::getRawOffset(this_00);
  if (iVar4 == iVar5) {
    iVar4 = TimeZoneRule::getDSTSavings(pTVar10);
    iVar5 = TimeZoneRule::getDSTSavings(this_00);
    if (iVar4 == iVar5) {
      if (bVar2) {
        return '\0';
      }
      UVar3 = findNext(this,(UDate)pp_Var15,'\0',transitionTime,fromRule,toRule);
      return UVar3;
    }
  }
  *transitionTime = (UDate)pp_Var15;
  *fromRule = pTVar10;
  *toRule = this_00;
  return '\x01';
}

Assistant:

UBool
RuleBasedTimeZone::findNext(UDate base, UBool inclusive, UDate& transitionTime,
                            TimeZoneRule*& fromRule, TimeZoneRule*& toRule) const {
    if (fHistoricTransitions == NULL) {
        return FALSE;
    }
    UBool isFinal = FALSE;
    UBool found = FALSE;
    Transition result;
    Transition *tzt = (Transition*)fHistoricTransitions->elementAt(0);
    UDate tt = tzt->time;
    if (tt > base || (inclusive && tt == base)) {
        result = *tzt;
        found = TRUE;
    } else {
        int32_t idx = fHistoricTransitions->size() - 1;        
        tzt = (Transition*)fHistoricTransitions->elementAt(idx);
        tt = tzt->time;
        if (inclusive && tt == base) {
            result = *tzt;
            found = TRUE;
        } else if (tt <= base) {
            if (fFinalRules != NULL) {
                // Find a transion time with finalRules
                TimeZoneRule *r0 = (TimeZoneRule*)fFinalRules->elementAt(0);
                TimeZoneRule *r1 = (TimeZoneRule*)fFinalRules->elementAt(1);
                UDate start0, start1;
                UBool avail0 = r0->getNextStart(base, r1->getRawOffset(), r1->getDSTSavings(), inclusive, start0);
                UBool avail1 = r1->getNextStart(base, r0->getRawOffset(), r0->getDSTSavings(), inclusive, start1);
                //  avail0/avail1 should be always TRUE
                if (!avail0 && !avail1) {
                    return FALSE;
                }
                if (!avail1 || start0 < start1) {
                    result.time = start0;
                    result.from = r1;
                    result.to = r0;
                } else {
                    result.time = start1;
                    result.from = r0;
                    result.to = r1;
                }
                isFinal = TRUE;
                found = TRUE;
            }
        } else {
            // Find a transition within the historic transitions
            idx--;
            Transition *prev = tzt;
            while (idx > 0) {
                tzt = (Transition*)fHistoricTransitions->elementAt(idx);
                tt = tzt->time;
                if (tt < base || (!inclusive && tt == base)) {
                    break;
                }
                idx--;
                prev = tzt;
            }
            result.time = prev->time;
            result.from = prev->from;
            result.to = prev->to;
            found = TRUE;
        }
    }
    if (found) {
        // For now, this implementation ignore transitions with only zone name changes.
        if (result.from->getRawOffset() == result.to->getRawOffset()
            && result.from->getDSTSavings() == result.to->getDSTSavings()) {
            if (isFinal) {
                return FALSE;
            } else {
                // No offset changes.  Try next one if not final
                return findNext(result.time, FALSE /* always exclusive */,
                    transitionTime, fromRule, toRule);
            }
        }
        transitionTime = result.time;
        fromRule = result.from;
        toRule = result.to;
        return TRUE;
    }
    return FALSE;
}